

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

Vec_Vec_t * Saig_ManCexMinComputeReason(Aig_Man_t *pAig,Abc_Cex_t *pCex,int fPiReason)

{
  int iVar1;
  int iVar2;
  Vec_Vec_t *vFrameCis_00;
  Vec_Vec_t *vFramePPs_00;
  Vec_Vec_t *pVVar3;
  Vec_Vec_t *vFrameReas;
  Vec_Vec_t *vFramePPs;
  Vec_Vec_t *vFrameCis;
  int fPiReason_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = pCex->nPis;
  iVar2 = Saig_ManPiNum(pAig);
  if (iVar1 != iVar2) {
    __assert_fail("pCex->nPis == Saig_ManPiNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                  ,0x1d4,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
  }
  iVar1 = pCex->nRegs;
  iVar2 = Saig_ManRegNum(pAig);
  if (iVar1 == iVar2) {
    if (-1 < pCex->iPo) {
      iVar1 = pCex->iPo;
      iVar2 = Saig_ManPoNum(pAig);
      if (iVar1 < iVar2) {
        vFrameCis_00 = Saig_ManCexMinCollectFrameTerms(pAig,pCex);
        vFramePPs_00 = Saig_ManCexMinCollectPhasePriority(pAig,pCex,vFrameCis_00);
        pVVar3 = Saig_ManCexMinCollectReason(pAig,pCex,vFrameCis_00,vFramePPs_00,fPiReason);
        Vec_VecFree(vFramePPs_00);
        Vec_VecFree(vFrameCis_00);
        return pVVar3;
      }
    }
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                  ,0x1d6,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
  }
  __assert_fail("pCex->nRegs == Saig_ManRegNum(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                ,0x1d5,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
}

Assistant:

Vec_Vec_t * Saig_ManCexMinComputeReason( Aig_Man_t * pAig, Abc_Cex_t * pCex, int fPiReason )
{
    Vec_Vec_t * vFrameCis, * vFramePPs, * vFrameReas;
    // sanity checks
    assert( pCex->nPis == Saig_ManPiNum(pAig) );
    assert( pCex->nRegs == Saig_ManRegNum(pAig) );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );
    // derive frame terms
    vFrameCis = Saig_ManCexMinCollectFrameTerms( pAig, pCex );
    // derive phase and priority
    vFramePPs = Saig_ManCexMinCollectPhasePriority( pAig, pCex, vFrameCis );
    // derive reasons for property failure
    vFrameReas = Saig_ManCexMinCollectReason( pAig, pCex, vFrameCis, vFramePPs, fPiReason );
    Vec_VecFree( vFramePPs );
    Vec_VecFree( vFrameCis );
    return vFrameReas;
}